

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

int quicly_decode_crypto_frame(uint8_t **src,uint8_t *end,quicly_stream_frame_t *frame)

{
  uint64_t uVar1;
  undefined8 *in_RDX;
  uint8_t *in_RSI;
  uint8_t **in_RDI;
  ptls_iovec_t pVar2;
  uint64_t len;
  uint8_t *local_38;
  size_t local_30;
  int local_4;
  
  *in_RDX = 0;
  *(byte *)(in_RDX + 1) = *(byte *)(in_RDX + 1) & 0xfe;
  uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
  in_RDX[2] = uVar1;
  if (((uVar1 == 0xffffffffffffffff) ||
      (uVar1 = ptls_decode_quicint(in_RDI,in_RSI), uVar1 == 0xffffffffffffffff)) ||
     ((ulong)((long)in_RSI - (long)*in_RDI) < uVar1)) {
    local_4 = 0x20007;
  }
  else {
    pVar2 = ptls_iovec_init(*in_RDI,uVar1);
    local_38 = pVar2.base;
    in_RDX[3] = local_38;
    local_30 = pVar2.len;
    in_RDX[4] = local_30;
    *in_RDI = *in_RDI + uVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline int quicly_decode_crypto_frame(const uint8_t **src, const uint8_t *end, quicly_stream_frame_t *frame)
{
    uint64_t len;

    frame->stream_id = 0;
    frame->is_fin = 0;

    if ((frame->offset = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((len = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((uint64_t)(end - *src) < len)
        goto Error;
    frame->data = ptls_iovec_init(*src, len);
    *src += len;

    return 0;
Error:
    return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;
}